

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O0

void __thiscall Dependency::Dependency(Dependency *this,string *path,string *dependent_file)

{
  bool bVar1;
  __type _Var2;
  undefined1 uVar3;
  char *pcVar4;
  reference pvVar5;
  size_type sVar6;
  ostream *poVar7;
  string *in_RDX;
  string *in_RSI;
  undefined1 *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *search_path;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  search_paths;
  string framework_name;
  string framework_path;
  string framework_root;
  string warning_msg;
  string original_file;
  char buffer [4096];
  string *in_stack_ffffffffffffeb98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeba0;
  undefined7 in_stack_ffffffffffffeba8;
  undefined1 in_stack_ffffffffffffebaf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffebb0;
  string *in_stack_ffffffffffffebb8;
  Dependency *in_stack_ffffffffffffebc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffebc8;
  byte local_1428;
  byte local_1427;
  byte local_1421;
  string *in_stack_ffffffffffffebe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffebe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffebf0;
  undefined7 in_stack_ffffffffffffec28;
  string local_1318 [39];
  byte local_12f1;
  string *in_stack_ffffffffffffed10;
  string *in_stack_ffffffffffffed18;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1220;
  undefined1 *local_1218;
  undefined1 local_1210 [31];
  byte local_11f1;
  string local_1170 [32];
  string local_1150 [32];
  string local_1130 [36];
  undefined4 local_110c;
  string local_1068 [32];
  string local_1048 [48];
  char local_1018 [3736];
  string *in_stack_fffffffffffffe80;
  string *in_stack_fffffffffffffe88;
  
  *in_RDI = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffebb0);
  std::__cxx11::string::string(in_stack_ffffffffffffebb0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x107dcd);
  std::__cxx11::string::string(in_stack_ffffffffffffebb0);
  rtrim_in_place(in_stack_ffffffffffffebe0);
  std::__cxx11::string::string(in_stack_ffffffffffffebb0);
  std::__cxx11::string::string(in_stack_ffffffffffffebb0);
  bVar1 = isRpath(in_stack_ffffffffffffeba0);
  if (bVar1) {
    searchFilenameInRpaths(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
    std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
  }
  else {
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (in_stack_ffffffffffffeba0);
    pcVar4 = realpath(pcVar4,local_1018);
    if (pcVar4 == (char *)0x0) {
      std::operator+((char *)in_stack_ffffffffffffebe8,in_stack_ffffffffffffebe0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8),
                     (char *)in_stack_ffffffffffffeba0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
      std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
      std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_ffffffffffffeba0,(char *)in_stack_ffffffffffffeb98);
    }
  }
  bVar1 = Settings::verboseOutput();
  if (bVar1) {
    poVar7 = std::operator<<((ostream *)&std::cout,"** Dependency ctor **");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
    if (((_Var2 ^ 0xffU) & 1) != 0) {
      poVar7 = std::operator<<((ostream *)&std::cout,"  dependent file:  ");
      poVar7 = std::operator<<(poVar7,in_RDX);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
    poVar7 = std::operator<<((ostream *)&std::cout,"  dependency path: ");
    poVar7 = std::operator<<(poVar7,in_RSI);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    poVar7 = std::operator<<((ostream *)&std::cout,"  original_file:   ");
    poVar7 = std::operator<<(poVar7,local_1048);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  if (((_Var2 ^ 0xffU) & 1) != 0) {
    AddSymlink(in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  }
  filePrefix((string *)CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
  stripPrefix((string *)CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
  std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1081ce);
  if (!bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x28))
    ;
    pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[](in_stack_ffffffffffffeba0,(size_type)in_stack_ffffffffffffeb98);
    if (*pvVar5 != '/') {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_ffffffffffffeba0,(char *)in_stack_ffffffffffffeb98);
    }
  }
  uVar3 = Settings::isPrefixBundled(in_stack_ffffffffffffeb98);
  if ((bool)uVar3) {
    sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffebc0,(char *)in_stack_ffffffffffffebb8,
                       (size_type)in_stack_ffffffffffffebb0);
    if (sVar6 != 0xffffffffffffffff) {
      *in_RDI = 1;
      getFrameworkRoot((string *)CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8));
      getFrameworkPath((string *)CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8));
      stripPrefix((string *)CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8));
      filePrefix((string *)CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
      std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
      std::operator+(in_stack_ffffffffffffebc8,&in_stack_ffffffffffffebc0->is_framework);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8),
                     in_stack_ffffffffffffeba0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8);
      std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
      std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
      bVar1 = Settings::verboseOutput();
      if (bVar1) {
        poVar7 = std::operator<<((ostream *)&std::cout,"  framework root: ");
        poVar7 = std::operator<<(poVar7,local_1130);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        poVar7 = std::operator<<((ostream *)&std::cout,"  framework path: ");
        poVar7 = std::operator<<(poVar7,local_1150);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        in_stack_ffffffffffffebe8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<((ostream *)&std::cout,"  framework name: ");
        in_stack_ffffffffffffebe0 =
             (string *)std::operator<<((ostream *)in_stack_ffffffffffffebe8,local_1170);
        std::ostream::operator<<
                  ((ostream *)in_stack_ffffffffffffebe0,std::endl<char,std::char_traits<char>>);
      }
      std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
      std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
      std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
    }
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x108554
                      );
    local_11f1 = 0;
    local_1421 = 1;
    if (!bVar1) {
      std::operator+(in_stack_ffffffffffffebc8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffebc0);
      local_11f1 = 1;
      bVar1 = fileExists((string *)CONCAT17(uVar3,in_stack_ffffffffffffec28));
      local_1421 = bVar1 ^ 0xff;
    }
    if ((local_11f1 & 1) != 0) {
      std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
    }
    if ((local_1421 & 1) != 0) {
      Settings::searchPaths_abi_cxx11_();
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_ffffffffffffebb0);
      if (bVar1) {
        initSearchPaths();
      }
      local_1218 = local_1210;
      local_1220._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_ffffffffffffeb98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffeb98);
      while (bVar1 = __gnu_cxx::
                     operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffeba0,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffeb98), ((bVar1 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&local_1220);
        std::operator+(in_stack_ffffffffffffebc8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffebc0);
        bVar1 = fileExists((string *)CONCAT17(uVar3,in_stack_ffffffffffffec28));
        std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
        if (bVar1) {
          std::operator+((char *)in_stack_ffffffffffffebe8,in_stack_ffffffffffffebe0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8),
                         (char *)in_stack_ffffffffffffeba0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8),
                         in_stack_ffffffffffffeba0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8),
                         (char *)in_stack_ffffffffffffeba0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=(in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
          std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
          std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
          std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
          std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
          Settings::missingPrefixes(true);
          break;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_1220);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_ffffffffffffebb0);
    }
    bVar1 = Settings::quietOutput();
    if (!bVar1) {
      std::operator<<((ostream *)&std::cout,local_1068);
    }
    local_12f1 = 0;
    bVar1 = Settings::isPrefixIgnored(in_stack_ffffffffffffebb8);
    local_1427 = 0;
    if (!bVar1) {
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x10895c);
      local_1428 = 1;
      if (!bVar1) {
        std::operator+(in_stack_ffffffffffffebc8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffebc0);
        local_12f1 = 1;
        bVar1 = fileExists((string *)CONCAT17(uVar3,in_stack_ffffffffffffec28));
        local_1428 = bVar1 ^ 0xff;
      }
      local_1427 = local_1428;
    }
    if ((local_12f1 & 1) != 0) {
      std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
    }
    if ((local_1427 & 1) != 0) {
      bVar1 = Settings::quietOutput();
      if (!bVar1) {
        in_stack_ffffffffffffebc8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<((ostream *)&std::cerr,"\n/!\\ WARNING: Dependency ");
        in_stack_ffffffffffffebc0 =
             (Dependency *)
             std::operator<<((ostream *)in_stack_ffffffffffffebc8,(string *)(in_RDI + 8));
        poVar7 = std::operator<<((ostream *)in_stack_ffffffffffffebc0," of ");
        poVar7 = std::operator<<(poVar7,in_RDX);
        std::operator<<(poVar7," not found\n");
      }
      bVar1 = Settings::verboseOutput();
      if (bVar1) {
        in_stack_ffffffffffffeba0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<((ostream *)&std::cout,"     path: ");
        std::operator+(in_stack_ffffffffffffebc8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_ffffffffffffebc0);
        in_stack_ffffffffffffeb98 =
             (string *)std::operator<<((ostream *)in_stack_ffffffffffffeba0,local_1318);
        std::ostream::operator<<
                  ((ostream *)in_stack_ffffffffffffeb98,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
      }
      Settings::missingPrefixes(true);
      getUserInputDirForFile(in_stack_ffffffffffffed18,in_stack_ffffffffffffed10);
      Settings::addSearchPath((string *)0x108b9d);
      std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffeba0,in_stack_ffffffffffffeb98);
    local_110c = 0;
  }
  else {
    local_110c = 1;
  }
  std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
  std::__cxx11::string::~string(in_stack_ffffffffffffeba0);
  return;
}

Assistant:

Dependency::Dependency(string path, const string& dependent_file)
    : is_framework(false)
{
    char buffer[PATH_MAX];
    rtrim_in_place(path);
    string original_file;
    string warning_msg;

    if (isRpath(path))
    {
        original_file = searchFilenameInRpaths(path, dependent_file);
    }
    else if (realpath(path.c_str(), buffer))
    {
        original_file = buffer;
    }
    else
    {
        warning_msg = "\n/!\\ WARNING: Cannot resolve path '" + path + "'\n";
        original_file = path;
    }

    if (Settings::verboseOutput())
    {
        cout << "** Dependency ctor **" << endl;
        if (path != dependent_file)
            cout << "  dependent file:  " << dependent_file << endl;
        cout << "  dependency path: " << path << endl;
        cout << "  original_file:   " << original_file << endl;
    }

    // check if given path is a symlink
    if (original_file != path)
        AddSymlink(path);

    prefix = filePrefix(original_file);
    filename = stripPrefix(original_file);

    if (!prefix.empty() && prefix[prefix.size()-1] != '/')
        prefix += "/";

    // check if this dependency is in /usr/lib, /System/Library, or in ignored list
    if (!Settings::isPrefixBundled(prefix))
        return;

    if (original_file.find(".framework") != string::npos)
    {
        is_framework = true;
        string framework_root = getFrameworkRoot(original_file);
        string framework_path = getFrameworkPath(original_file);
        string framework_name = stripPrefix(framework_root);
        prefix = filePrefix(framework_root);
        filename = framework_name + "/" + framework_path;
        if (Settings::verboseOutput())
        {
            cout << "  framework root: " << framework_root << endl;
            cout << "  framework path: " << framework_path << endl;
            cout << "  framework name: " << framework_name << endl;
        }
    }

    // check if the lib is in a known location
    if (prefix.empty() || !fileExists(prefix+filename))
    {
        vector<string> search_paths = Settings::searchPaths();
        if (search_paths.empty())
            initSearchPaths();
        // check if file is contained in one of the paths
        for (const auto& search_path : search_paths)
        {
            if (fileExists(search_path+filename))
            {
                warning_msg += "FOUND " + filename + " in " + search_path + "\n";
                prefix = search_path;
                Settings::missingPrefixes(true);
                break;
            }
        }
    }

    if (!Settings::quietOutput())
        cout << warning_msg;

    // if the location is still unknown, ask the user for search path
    if (!Settings::isPrefixIgnored(prefix) && (prefix.empty() || !fileExists(prefix+filename)))
    {
        if (!Settings::quietOutput())
            cerr << "\n/!\\ WARNING: Dependency " << filename << " of " << dependent_file << " not found\n";
        if (Settings::verboseOutput())
            cout << "     path: " << (prefix+filename) << endl;
        Settings::missingPrefixes(true);
        Settings::addSearchPath(getUserInputDirForFile(filename, dependent_file));
    }
    new_name = filename;
}